

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_resize2.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  char *pcVar12;
  byte bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  ALLEGRO_EVENT event;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    pcVar12 = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    al_init_image_addon();
    al_init_font_addon();
    al_set_new_display_flags(0x50);
    lVar7 = al_create_display(0x280,0x1e0);
    if (lVar7 == 0) {
      pcVar12 = "Unable to set any graphic mode\n";
    }
    else {
      al_set_new_bitmap_flags(1);
      lVar8 = al_load_bitmap("data/mysha.pcx");
      if (lVar8 != 0) {
        uVar9 = al_create_builtin_font();
        uVar10 = al_create_event_queue();
        uVar11 = al_get_display_event_source(lVar7);
        al_register_event_source(uVar10,uVar11);
        uVar11 = al_get_keyboard_event_source();
        al_register_event_source(uVar10,uVar11);
        do {
          bVar2 = al_is_event_queue_empty(uVar10);
          if (bVar2 != 0) {
            al_map_rgb(0xff,0,0);
            al_clear_to_color();
            iVar3 = al_get_bitmap_width(lVar8);
            fVar15 = (float)iVar3;
            iVar3 = al_get_bitmap_height(lVar8);
            fVar16 = (float)iVar3;
            iVar3 = al_get_display_width(lVar7);
            fVar17 = (float)iVar3;
            iVar3 = al_get_display_height(lVar7);
            uVar19 = 0;
            uVar20 = 0;
            al_draw_scaled_bitmap(0,0,fVar15,fVar16,0,0,fVar17,(float)iVar3,lVar8,0);
            uVar18 = al_map_rgb(0xff,0xff,0);
            uVar21 = extraout_XMM0_Dc;
            al_get_font_line_height(uVar9);
            uVar4 = al_get_display_width(lVar7);
            uVar5 = al_get_display_height(lVar7);
            uVar6 = al_get_display_flags(lVar7);
            pcVar12 = "yes";
            if ((uVar6 >> 0xd & 1) == 0) {
              pcVar12 = "no";
            }
            al_draw_multiline_textf
                      (uVar18,uVar19,0,0,uVar9,0,
                       "size: %d x %d\nmaximized: %s\n+ key to maximize\n- key to un-maximize",uVar4
                       ,uVar5,pcVar12,lVar8,uVar4,uVar19,uVar20,uVar18,uVar21);
            al_flip_display();
          }
          bVar2 = bVar2 ^ 1;
          do {
            al_wait_for_event(uVar10,&event);
            bVar13 = bVar2;
            if (event.type == 0x29) {
              al_acknowledge_resize(event.any.source);
              bVar13 = 1;
            }
            bVar14 = event.type != 0x28;
            if ((event.type == 10) && (event.display.width == 0x3b)) {
LAB_001026fd:
              al_destroy_bitmap(lVar8);
              al_destroy_display(lVar7);
              return 0;
            }
            if (event.display.height == 0x2b && event.type == 0xb) {
              al_set_display_flag(lVar7,0x2000,1);
            }
            if ((event.type == 0xb) && (event.display.height == 0x2d)) {
              al_set_display_flag(lVar7,0x2000,0);
            }
            if (event.type == 0x2a) goto LAB_001026fd;
            bVar2 = 0;
          } while (bVar14 && (bVar13 & 1) == 0);
        } while( true );
      }
      pcVar12 = "Unable to load image\n";
    }
  }
  abort_example(pcVar12);
  iVar3 = __cxa_atexit();
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   ALLEGRO_FONT *font;
   bool redraw;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_install_keyboard();
   al_init_image_addon();
   al_init_font_addon();

   al_set_new_display_flags(ALLEGRO_RESIZABLE |
      ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Unable to set any graphic mode\n");
   }

   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   bmp = al_load_bitmap("data/mysha.pcx");
   if (!bmp) {
      abort_example("Unable to load image\n");
   }

   font = al_create_builtin_font();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());

   redraw = true;
   while (true) {
      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgb(255, 0, 0));
         al_draw_scaled_bitmap(bmp,
            0, 0, al_get_bitmap_width(bmp), al_get_bitmap_height(bmp),
            0, 0, al_get_display_width(display), al_get_display_height(display),
            0);
      al_draw_multiline_textf(font, al_map_rgb(255, 255, 0), 0, 0, 640,
         al_get_font_line_height(font), 0,
         "size: %d x %d\n"
         "maximized: %s\n"
         "+ key to maximize\n"
         "- key to un-maximize",
         al_get_display_width(display),
         al_get_display_height(display),
         al_get_display_flags(display) & ALLEGRO_MAXIMIZED ? "yes" :
         "no");

         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(event.display.source);
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_EXPOSE) {
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
            event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR &&
            event.keyboard.unichar == '+') {
         al_set_display_flag(display, ALLEGRO_MAXIMIZED, true);
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR &&
            event.keyboard.unichar == '-') {
         al_set_display_flag(display, ALLEGRO_MAXIMIZED, false);
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
   }

   al_destroy_bitmap(bmp);
   al_destroy_display(display);

   return 0;

}